

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_49742::CompressZip
               (uchar *dst,unsigned_long_long *compressedSize,uchar *src,unsigned_long srcSize)

{
  byte bVar1;
  int iVar2;
  reference pvVar3;
  uchar *puVar4;
  char *pcVar5;
  mz_ulong mStack_90;
  int ret;
  mz_ulong outSize;
  int d;
  int p;
  uchar *stop_1;
  uchar *t;
  char *stop;
  char *t2;
  char *t1;
  allocator<unsigned_char> local_41;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  unsigned_long srcSize_local;
  uchar *src_local;
  unsigned_long_long *compressedSize_local;
  uchar *dst_local;
  
  tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)srcSize;
  std::allocator<unsigned_char>::allocator(&local_41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,srcSize,&local_41);
  std::allocator<unsigned_char>::~allocator(&local_41);
  t2 = (char *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  t = src + (long)tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
  stop = (char *)(pvVar3 + ((ulong)(tmpBuf.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) >> 1));
  srcSize_local = (unsigned_long)src;
  while (srcSize_local < t) {
    puVar4 = (uchar *)(srcSize_local + 1);
    pcVar5 = t2 + 1;
    *t2 = *(char *)srcSize_local;
    t2 = pcVar5;
    if (t <= puVar4) break;
    srcSize_local = srcSize_local + 2;
    *stop = *puVar4;
    stop = stop + 1;
  }
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  stop_1 = pvVar3 + 1;
  _d = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  _d = _d + (long)tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
  bVar1 = stop_1[-1];
  for (; outSize._4_4_ = (uint)bVar1, stop_1 < _d; stop_1 = stop_1 + 1) {
    outSize._0_4_ = (*stop_1 - outSize._4_4_) + 0x180;
    bVar1 = *stop_1;
    *stop_1 = (uchar)(int)outSize;
  }
  mStack_90 = mz_compressBound((mz_ulong)
                               tmpBuf.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  iVar2 = mz_compress(dst,&stack0xffffffffffffff70,pvVar3,
                      (mz_ulong)
                      tmpBuf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (iVar2 != 0) {
    __assert_fail("ret == miniz::MZ_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                  ,0x1bc6,
                  "void (anonymous namespace)::CompressZip(unsigned char *, unsigned long long &, const unsigned char *, unsigned long)"
                 );
  }
  *compressedSize = mStack_90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return;
}

Assistant:

void CompressZip(unsigned char *dst, unsigned long long &compressedSize,
                 const unsigned char *src, unsigned long srcSize) {

  std::vector<unsigned char> tmpBuf(srcSize);

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  //
  // Reorder the pixel data.
  //

  {
    char *t1 = (char *)&tmpBuf.at(0);
    char *t2 = (char *)&tmpBuf.at(0) + (srcSize + 1) / 2;
    const char *stop = (const char *)src + srcSize;

    while (true) {
      if ((const char *)src < stop)
        *(t1++) = *(src++);
      else
        break;

      if ((const char *)src < stop)
        *(t2++) = *(src++);
      else
        break;
    }
  }

  //
  // Predictor.
  //

  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + srcSize;
    int p = t[-1];

    while (t < stop) {
      int d = int(t[0]) - p + (128 + 256);
      p = t[0];
      t[0] = d;
      ++t;
    }
  }

  //
  // Compress the data using miniz
  //

  miniz::mz_ulong outSize = miniz::mz_compressBound(srcSize);
  int ret = miniz::mz_compress(dst, &outSize,
                               (const unsigned char *)&tmpBuf.at(0), srcSize);
  assert(ret == miniz::MZ_OK);
  (void)ret;

  compressedSize = outSize;
}